

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O1

int nga_wait_internal(Integer *nbhandle)

{
  struct_armcihdl_t *psVar1;
  ga_armcihdl_t *nb_handle;
  ulong uVar2;
  gai_nbhdl_t *inbhandle;
  
  uVar2 = (ulong)(uint)*nbhandle & 0xff;
  if ((uint)*nbhandle >> 8 == ga_ihdl_array[uVar2].ga_nbtag) {
    if (ga_ihdl_array[uVar2].active == 0) {
      printf("p[%ld] nga_wait_internal: GA NB handle %d inactive slot: %d tag: %d\n",GAme);
    }
    nb_handle = ga_ihdl_array[uVar2].ahandle;
    while (nb_handle != (ga_armcihdl_t *)0x0) {
      psVar1 = nb_handle->next;
      ARMCI_Wait(&nb_handle->handle);
      nb_handle->active = 0;
      nb_handle->next = (struct_armcihdl_t *)0x0;
      nb_handle->previous = (struct_armcihdl_t *)0x0;
      nb_handle = psVar1;
    }
    ga_ihdl_array[uVar2].ahandle = (ga_armcihdl_t *)0x0;
    ga_ihdl_array[uVar2].count = 0;
    ga_ihdl_array[uVar2].active = 0;
  }
  return 0;
}

Assistant:

int nga_wait_internal(Integer *nbhandle){
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  int index = inbhandle->ihdl_index;
  int retval = 0;
  int tag = inbhandle->ga_nbtag;
  /* check if tags match. If they don't then this request was already completed
   * so the handle can be used for another GA non-blocking call. Just return in
   * this case */
  if (tag == ga_ihdl_array[index].ga_nbtag) {
    if (ga_ihdl_array[index].active == 0) {
      printf("p[%ld] nga_wait_internal: GA NB handle %d inactive slot: %d tag: %d\n",
          GAme,*((int*)inbhandle),index,tag);
    }
    ga_armcihdl_t* next = ga_ihdl_array[index].ahandle;
    /* Loop over linked list and complete all remaining armci non-blocking calls */
    while(next) {
      ga_armcihdl_t* tmp = next->next;
      /* Complete the call */
      ARMCI_Wait(&next->handle);
      /* reinitialize armci_hlt_t data structure */
      next->next = NULL;
      next->previous = NULL;
      next->active = 0;
      ARMCI_INIT_HANDLE(&next->handle);
      next = tmp;
    }
    ga_ihdl_array[index].ahandle = NULL;
    ga_ihdl_array[index].count = 0;
    ga_ihdl_array[index].active = 0;
  }

  return(retval);
}